

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

Error __thiscall argstest::Command::GetError(Command *this)

{
  uint uVar1;
  Command *this_local;
  
  uVar1 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((uVar1 & 1) == 0) {
    this_local._4_4_ = None;
  }
  else if ((this->super_Group).super_Base.error == None) {
    if (this->subparserError == None) {
      this_local._4_4_ = Group::GetError(&this->super_Group);
    }
    else {
      this_local._4_4_ = this->subparserError;
    }
  }
  else {
    this_local._4_4_ = (this->super_Group).super_Base.error;
  }
  return this_local._4_4_;
}

Assistant:

virtual Error GetError() const override
            {
                if (!Matched())
                {
                    return Error::None;
                }

                if (error != Error::None)
                {
                    return error;
                }

                if (subparserError != Error::None)
                {
                    return subparserError;
                }

                return Group::GetError();
            }